

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O2

void __thiscall
CRegexStack::pop(CRegexStack *this,int *start_ofs,int *str_ofs,size_t *curlen,re_state_id *state,
                re_state_id *final,re_group_register *regs,short *loop_vars,int *iter)

{
  long lVar1;
  int *piVar2;
  
  piVar2 = (int *)(this->buf_ + (long)this->sp_ + 0x24);
  *start_ofs = piVar2[-8];
  *str_ofs = piVar2[-7];
  *curlen = (long)piVar2[-6];
  *state = piVar2[-5];
  *final = piVar2[-4];
  *iter = piVar2[-2];
  for (; piVar2 < this->buf_ + this->used_; piVar2 = piVar2 + 3) {
    lVar1 = (long)*piVar2;
    if (lVar1 < 10) {
      regs[lVar1] = *(re_group_register *)(piVar2 + 1);
    }
    else {
      loop_vars[lVar1 + -10] = (short)piVar2[1];
    }
  }
  this->used_ = (long)this->sp_;
  this->sp_ = *(int *)(this->buf_ + (long)this->sp_ + 0x20);
  return;
}

Assistant:

void pop(int *start_ofs, int *str_ofs, size_t *curlen,
             re_state_id *state, re_state_id *final,
             re_group_register *regs, short *loop_vars, int *iter)
    {
        /* get the stack pointer */
        regex_stack_entry *fp = (regex_stack_entry *)(buf_ + sp_);

        /* restore the string offset and state ID */
        *start_ofs = fp->start_ofs;
        *str_ofs = fp->str_ofs;
        *curlen = fp->curlen;
        *state = fp->state;
        *final = fp->final;
        *iter = fp->iter;
        
        /* run through the saved registers/variables in the state */
        for (regex_stack_var *var = (regex_stack_var *)(fp + 1) ;
             var < (regex_stack_var *)(buf_ + used_) ; ++var)
        {
            /* sense the type */
            if (var->id < RE_GROUP_REG_CNT)
            {
                /* it's a group register */
                regs[var->id] = var->val.group;
            }
            else
            {
                /* it's a loop variable */
                loop_vars[var->id - RE_GROUP_REG_CNT] = var->val.loopvar;
            }
        }

        /* we're done with the stop stack frame, so discard it */
        discard();
    }